

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O0

VectorU * anurbs::HilbertCurve<3L>::point_at(VectorU *__return_storage_ptr__,size_t m,size_t h)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  Scalar *pSVar4;
  size_t local_68;
  Index j_1;
  size_t l;
  Index j;
  size_t w;
  Index i;
  ulong local_30;
  size_t vd;
  size_t ve;
  size_t h_local;
  size_t m_local;
  VectorU *p;
  
  vd = 0;
  local_30 = 0;
  ve = h;
  h_local = m;
  m_local = (size_t)__return_storage_ptr__;
  Eigen::DenseBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>::Zero();
  Eigen::Matrix<unsigned_long,1,3,1,1,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,3,1,1,3>>>
            ((Matrix<unsigned_long,1,3,1,1,3> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
              *)&i);
  w = h_local;
  while (w = w - 1, -1 < (long)w) {
    j = 0;
    for (l = 0; sVar2 = vd, uVar1 = local_30, (long)l < 3; l = l + 1) {
      sVar2 = bit(ve,w * 3 + l);
      j = (sVar2 << ((byte)l & 0x3f)) + j;
    }
    sVar3 = gc(j);
    sVar2 = inverse_t(sVar2,uVar1,sVar3);
    for (local_68 = 0; sVar3 = vd, (long)local_68 < 3; local_68 = local_68 + 1) {
      sVar3 = bit(sVar2,local_68);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1> *)
                          __return_storage_ptr__,local_68);
      *pSVar4 = (sVar3 << ((byte)w & 0x3f)) + *pSVar4;
    }
    sVar2 = e(j);
    sVar2 = rol(sVar2,local_30 + 1);
    uVar1 = local_30;
    vd = sVar3 ^ sVar2;
    sVar2 = d(j);
    local_30 = (uVar1 + sVar2 + 1) % 3;
  }
  return __return_storage_ptr__;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }